

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::Detail::Approx::equalityComparisonImpl(Approx *this,double other)

{
  double dVar1;
  byte bVar2;
  double dVar3;
  
  dVar1 = this->m_value;
  if ((dVar1 + this->m_margin < other) || (bVar2 = 1, this->m_margin + other < dVar1)) {
    dVar3 = 0.0;
    if (ABS(dVar1) != INFINITY) {
      dVar3 = ABS(dVar1);
    }
    dVar3 = (dVar3 + this->m_scale) * this->m_epsilon;
    bVar2 = -(other <= dVar1 + dVar3) & -(dVar1 <= dVar3 + other);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Approx::equalityComparisonImpl(const double other) const {
        // First try with fixed margin, then compute margin based on epsilon, scale and Approx's value
        // Thanks to Richard Harris for his help refining the scaled margin value
        return marginComparison(m_value, other, m_margin)
            || marginComparison(m_value, other, m_epsilon * (m_scale + std::fabs(std::isinf(m_value)? 0 : m_value)));
    }